

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

realtype N_VMinQuotient_Serial(N_Vector num,N_Vector denom)

{
  double dVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  double local_40;
  realtype min;
  realtype *dd;
  realtype *nd;
  sunindextype N;
  sunindextype i;
  int notEvenOnce;
  N_Vector denom_local;
  N_Vector num_local;
  
  lVar2 = *(long *)((long)num->content + 8);
  lVar3 = *(long *)((long)denom->content + 8);
  bVar4 = true;
  min = 1.79769313486232e+308;
  for (i = 0; i < *num->content; i = i + 1) {
    dVar1 = *(double *)(lVar3 + (long)i * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if (bVar4) {
        min = *(double *)(lVar2 + (long)i * 8) / *(double *)(lVar3 + (long)i * 8);
        bVar4 = false;
      }
      else {
        if (*(double *)(lVar2 + (long)i * 8) / *(double *)(lVar3 + (long)i * 8) <= min) {
          local_40 = *(double *)(lVar2 + (long)i * 8) / *(double *)(lVar3 + (long)i * 8);
        }
        else {
          local_40 = min;
        }
        min = local_40;
      }
    }
  }
  return min;
}

Assistant:

realtype N_VMinQuotient_Serial(N_Vector num, N_Vector denom)
{
  booleantype notEvenOnce;
  sunindextype i, N;
  realtype *nd, *dd, min;

  nd = dd = NULL;

  N  = NV_LENGTH_S(num);
  nd = NV_DATA_S(num);
  dd = NV_DATA_S(denom);

  notEvenOnce = SUNTRUE;
  min = BIG_REAL;

  for (i = 0; i < N; i++) {
    if (dd[i] == ZERO) continue;
    else {
      if (!notEvenOnce) min = SUNMIN(min, nd[i]/dd[i]);
      else {
	min = nd[i]/dd[i];
        notEvenOnce = SUNFALSE;
      }
    }
  }

  return(min);
}